

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatusFunction.hpp
# Opt level: O3

void __thiscall
OpenMD::DumpStatusFunction::DumpStatusFunction(DumpStatusFunction *this,SimInfo *info)

{
  pointer pcVar1;
  Stats *this_00;
  DumpWriter *this_01;
  StatWriter *this_02;
  string local_38;
  
  (this->super_StatusFunction)._vptr_StatusFunction =
       (_func_int **)&PTR__DumpStatusFunction_002ffe38;
  this->info_ = info;
  this_00 = (Stats *)operator_new(0x68);
  Stats::Stats(this_00,info);
  this->stats = this_00;
  this_01 = (DumpWriter *)operator_new(0x60);
  DumpWriter::DumpWriter(this_01,this->info_);
  this->dumpWriter = this_01;
  Stats::setStatsMask(this->stats,(StatsBitSet)0x5);
  this_02 = (StatWriter *)operator_new(0x448);
  pcVar1 = (this->info_->statFileName_)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->info_->statFileName_)._M_string_length);
  StatWriter::StatWriter(this_02,&local_38,this->stats);
  this->statWriter = this_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DumpStatusFunction(SimInfo* info) : StatusFunction(), info_(info) {
      stats      = new Stats(info_);
      dumpWriter = new DumpWriter(info_);
      Stats::StatsBitSet mask;
      mask.set(Stats::TIME);
      mask.set(Stats::POTENTIAL_ENERGY);
      stats->setStatsMask(mask);
      statWriter = new StatWriter(info_->getStatFileName(), stats);
    }